

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O1

void __thiscall QHeaderViewPrivate::updateDefaultSectionSizeFromStyle(QHeaderViewPrivate *this)

{
  QWidget *this_00;
  int iVar1;
  int iVar2;
  QStyle *pQVar3;
  
  this_00 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  if (this->orientation == Horizontal) {
    pQVar3 = QWidget::style(this_00);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x59,0,this_00);
  }
  else {
    iVar2 = QHeaderView::minimumSectionSize((QHeaderView *)this_00);
    pQVar3 = QWidget::style(this_00);
    iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,0x5a,0,this_00);
    if (iVar1 < iVar2) {
      iVar1 = iVar2;
    }
  }
  this->defaultSectionSize = iVar1;
  return;
}

Assistant:

void QHeaderViewPrivate::updateDefaultSectionSizeFromStyle()
{
    Q_Q(QHeaderView);
    if (orientation == Qt::Horizontal) {
        defaultSectionSize = q->style()->pixelMetric(QStyle::PM_HeaderDefaultSectionSizeHorizontal, nullptr, q);
    } else {
        defaultSectionSize = qMax(q->minimumSectionSize(),
                                  q->style()->pixelMetric(QStyle::PM_HeaderDefaultSectionSizeVertical, nullptr, q));
    }
}